

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QMap<int,_QByteArray> parseTzAbbreviations(QDataStream *ds,int tzh_charcnt,QList<QTzType> *types)

{
  char cVar1;
  Status SVar2;
  const_iterator o;
  int in_EDX;
  QDataStream *in_RSI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  int i_1;
  QTzType *type;
  QList<QTzType> *__range1;
  int i;
  QMap<int,_QByteArray> *map;
  QByteArray abbrev;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArray input;
  quint8 ch;
  undefined7 in_stack_ffffffffffffff08;
  char in_stack_ffffffffffffff0f;
  QDataStream *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff70;
  int iVar4;
  uint3 in_stack_ffffffffffffff7c;
  uint uVar5;
  const_iterator local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffff7c;
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMap<int,_QByteArray>::QMap((QMap<int,_QByteArray> *)0x74ba45);
  local_9 = 0xaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x74ba87);
  iVar4 = 0;
  while( true ) {
    bVar3 = false;
    if (iVar4 < in_EDX) {
      SVar2 = QDataStream::status(in_RSI);
      bVar3 = SVar2 == Ok;
    }
    if (!bVar3) break;
    QDataStream::operator>>
              (in_stack_ffffffffffffff10,
               (quint8 *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    SVar2 = QDataStream::status(in_RSI);
    if (SVar2 != Ok) goto LAB_0074bd49;
    QByteArray::append((QByteArray *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
    iVar4 = iVar4 + 1;
  }
  local_30.i = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QTzType>::begin((QList<QTzType> *)in_stack_ffffffffffffff10);
  o = QList<QTzType>::end((QList<QTzType> *)in_stack_ffffffffffffff10);
  while (bVar3 = QList<QTzType>::const_iterator::operator!=(&local_30,o), bVar3) {
    QList<QTzType>::const_iterator::operator*(&local_30);
    QByteArray::QByteArray((QByteArray *)0x74bc51);
    while (cVar1 = QByteArray::at((QByteArray *)
                                  CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                                  0x74bc70), cVar1 != '\0') {
      QByteArray::at((QByteArray *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     0x74bc94);
      QByteArray::append((QByteArray *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
    }
    QMap<int,_QByteArray>::operator[]
              ((QMap<int,_QByteArray> *)CONCAT44(uVar5,iVar4),in_stack_ffffffffffffff70);
    QByteArray::operator=
              ((QByteArray *)in_stack_ffffffffffffff10,
               (QByteArray *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    QByteArray::~QByteArray((QByteArray *)0x74bd28);
    QList<QTzType>::const_iterator::operator++(&local_30);
  }
LAB_0074bd49:
  uVar5 = 0x1000000;
  QByteArray::~QByteArray((QByteArray *)0x74bd56);
  if ((uVar5 & 0x1000000) == 0) {
    QMap<int,_QByteArray>::~QMap((QMap<int,_QByteArray> *)0x74bd82);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
            )in_RDI.d.ptr;
}

Assistant:

static QMap<int, QByteArray> parseTzAbbreviations(QDataStream &ds, int tzh_charcnt, const QList<QTzType> &types)
{
    // Parse the abbreviation list which is tzh_charcnt long with '\0' separated strings. The
    // QTzType.tz_abbrind index points to the first char of the abbreviation in the array, not the
    // occurrence in the list. It can also point to a partial string so we need to use the actual typeList
    // index values when parsing.  By using a map with tz_abbrind as ordered key we get both index
    // methods in one data structure and can convert the types afterwards.
    QMap<int, QByteArray> map;
    quint8 ch;
    QByteArray input;
    // First parse the full abbrev string
    for (int i = 0; i < tzh_charcnt && ds.status() == QDataStream::Ok; ++i) {
        ds >> ch;
        if (ds.status() == QDataStream::Ok)
            input.append(char(ch));
        else
            return map;
    }
    // Then extract all the substrings pointed to by types
    for (const QTzType &type : types) {
        QByteArray abbrev;
        for (int i = type.tz_abbrind; input.at(i) != '\0'; ++i)
            abbrev.append(input.at(i));
        // Have reached end of an abbreviation, so add to map
        map[type.tz_abbrind] = abbrev;
    }
    return map;
}